

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

double __thiscall test::avg_ts(test *this)

{
  double dVar1;
  test *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  
  get_ts(in_stack_00000018);
  dVar1 = avg<double>(in_stack_ffffffffffffffd8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  return dVar1;
}

Assistant:

double avg_ts() const { return ::avg(get_ts()); }